

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O1

Gia_Man_t * Gia_ManRetimeForwardOne(Gia_Man_t *p,int *pnRegFixed,int *pnRegMoves)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *vCut;
  void **ppvVar8;
  Gia_Man_t *pGVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  Gia_Obj_t *pGVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  uint uVar20;
  
  if (p->vFlopClasses == (Vec_Int_t *)0x0) {
    p_00 = (Vec_Int_t *)0x0;
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    iVar13 = p->nObjs;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar10 = 0x10;
    if (0xe < iVar13 - 1U) {
      iVar10 = iVar13;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar10;
    if (iVar10 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)iVar10 << 2);
    }
    p_00->pArray = piVar6;
    if (0 < p->nObjs) {
      iVar13 = 0;
      do {
        Vec_IntPush(p_00,-1);
        iVar13 = iVar13 + 1;
      } while (iVar13 < p->nObjs);
    }
    uVar14 = p->nRegs;
    uVar12 = (ulong)uVar14;
    if (0 < (int)uVar14) {
      pVVar7 = p->vCis;
      lVar11 = 0;
      do {
        iVar13 = pVVar7->nSize;
        uVar14 = (uint)uVar12;
        uVar12 = (ulong)(iVar13 - uVar14) + lVar11;
        iVar10 = (int)uVar12;
        if ((iVar10 < 0) || (iVar13 <= iVar10)) goto LAB_007aa1a0;
        iVar13 = pVVar7->pArray[uVar12 & 0xffffffff];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_007aa162;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (p->vFlopClasses->nSize <= lVar11) goto LAB_007aa1a0;
        if (p_00->nSize <= iVar13) goto LAB_007aa21c;
        p_00->pArray[iVar13] = p->vFlopClasses->pArray[lVar11];
        lVar11 = lVar11 + 1;
        uVar14 = p->nRegs;
        uVar12 = (ulong)(int)uVar14;
      } while (lVar11 < (long)uVar12);
    }
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    uVar20 = 0x10;
    if (0xe < uVar14 - 1) {
      uVar20 = uVar14;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = uVar20;
    if (uVar20 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar20 << 2);
    }
    pVVar7->pArray = piVar6;
  }
  Gia_ManIncrementTravId(p);
  Gia_ManMarkAutonomous(p);
  Gia_ManIncrementTravId(p);
  *pnRegFixed = 0;
  iVar13 = p->nRegs;
  if (0 < iVar13) {
    pVVar3 = p->vCis;
    iVar10 = 0;
    do {
      iVar1 = pVVar3->nSize;
      uVar14 = (iVar1 - iVar13) + iVar10;
      if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_007aa1a0;
      iVar13 = pVVar3->pArray[uVar14];
      lVar11 = (long)iVar13;
      if ((lVar11 < 0) || (p->nObjs <= iVar13)) goto LAB_007aa162;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar13) goto LAB_007aa1bf;
      if (p->pTravIds[lVar11] == p->nTravIds + -1) {
        p->pTravIds[lVar11] = p->nTravIds;
      }
      else {
        *pnRegFixed = *pnRegFixed + 1;
      }
      iVar10 = iVar10 + 1;
      iVar13 = p->nRegs;
    } while (iVar10 < iVar13);
  }
  *pnRegMoves = 0;
  uVar12 = (ulong)(uint)p->nObjs;
  if ((0 < p->nObjs) && (pGVar4 = p->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar11 = 0;
    lVar15 = 0;
    pGVar17 = pGVar4;
    do {
      uVar16 = *(ulong *)pGVar17;
      if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar16) {
        iVar13 = (int)(uVar16 & 0x1fffffff);
        pGVar18 = (Gia_Obj_t *)((long)pGVar17 + (ulong)(uint)(iVar13 * 4) * -3);
        if (pGVar18 < pGVar4) goto LAB_007aa181;
        if (pGVar4 + (int)uVar12 <= pGVar18) goto LAB_007aa181;
        iVar13 = (int)((long)(lVar11 + (ulong)(uint)(iVar13 << 2) * -3) >> 2) * -0x55555555;
        if (p->nTravIdsAlloc <= iVar13) {
LAB_007aa1fd:
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar6 = p->pTravIds;
        if (piVar6[iVar13] == p->nTravIds) {
          uVar14 = (uint)(uVar16 >> 0x20);
          uVar20 = uVar14 & 0x1fffffff;
          pGVar18 = (Gia_Obj_t *)((long)pGVar17 + (ulong)(uVar20 * 4) * -3);
          if ((pGVar18 < pGVar4) || (pGVar4 + (int)uVar12 <= pGVar18)) goto LAB_007aa181;
          iVar13 = (int)((long)(lVar11 + (ulong)(uVar20 << 2) * -3) >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar13) goto LAB_007aa1fd;
          if (piVar6[iVar13] == p->nTravIds) {
            if (p_00 != (Vec_Int_t *)0x0) {
              uVar16 = (ulong)-((uint)uVar16 & 0x1fffffff) + lVar15;
              iVar13 = (int)uVar16;
              if (iVar13 < 0) goto LAB_007aa1a0;
              iVar10 = p_00->nSize;
              if (iVar10 <= iVar13) goto LAB_007aa1a0;
              uVar19 = (ulong)-(uVar14 & 0x1fffffff) + lVar15;
              iVar13 = (int)uVar19;
              if ((iVar13 < 0) || (iVar10 <= iVar13)) goto LAB_007aa1a0;
              piVar5 = p_00->pArray;
              if (piVar5[uVar16 & 0xffffffff] != piVar5[uVar19 & 0xffffffff]) goto LAB_007a9b93;
              if ((int)uVar12 <= lVar15) goto LAB_007aa181;
              if (iVar10 <= lVar15) {
LAB_007aa21c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              piVar5[lVar15] = piVar5[uVar16 & 0xffffffff];
            }
            if (p->nObjs <= lVar15) goto LAB_007aa181;
            if (p->nTravIdsAlloc <= lVar15) goto LAB_007aa1de;
            piVar6[lVar15] = p->nTravIds;
            *pnRegMoves = *pnRegMoves + 1;
          }
        }
      }
LAB_007a9b93:
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)p->nObjs;
      pGVar17 = pGVar17 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar15 < (long)uVar12);
  }
  iVar13 = p->nRegs;
  if (0 < iVar13) {
    pVVar3 = p->vCis;
    iVar10 = 0;
    do {
      iVar1 = pVVar3->nSize;
      uVar14 = (iVar1 - iVar13) + iVar10;
      if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_007aa1a0;
      iVar13 = pVVar3->pArray[uVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) {
LAB_007aa162:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar13) goto LAB_007aa1de;
      p->pTravIds[iVar13] = p->nTravIds;
      iVar10 = iVar10 + 1;
      iVar13 = p->nRegs;
    } while (iVar10 < iVar13);
  }
  vCut = (Vec_Ptr_t *)malloc(0x10);
  vCut->nCap = 1000;
  vCut->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  vCut->pArray = ppvVar8;
  Gia_ManIncrementTravId(p);
  uVar12 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar11 = 0;
    lVar15 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if ((int)uVar12 <= lVar15) goto LAB_007aa181;
      if (p->nTravIdsAlloc <= lVar15) goto LAB_007aa1bf;
      iVar13 = p->nTravIds + -1;
      if (p->pTravIds[lVar15] != iVar13) {
        uVar16 = *(ulong *)(&pGVar4->field_0x0 + lVar11) & 0x1fffffff;
        if (uVar16 != 0x1fffffff) {
          iVar10 = (int)uVar16;
          pGVar17 = (Gia_Obj_t *)((long)pGVar4 + lVar11 + (ulong)(uint)(iVar10 * 4) * -3);
          if ((pGVar17 < pGVar4) || (pGVar4 + (int)uVar12 <= pGVar17)) goto LAB_007aa181;
          iVar10 = (int)((long)(lVar11 + (ulong)(uint)(iVar10 << 2) * -3) >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar10) {
LAB_007aa1bf:
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x265,"int Gia_ObjIsTravIdPrevious(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (p->pTravIds[iVar10] == iVar13) {
            if (pVVar7 != (Vec_Int_t *)0x0) {
              uVar12 = (ulong)-((uint)*(ulong *)(&pGVar4->field_0x0 + lVar11) & 0x1fffffff) + lVar15
              ;
              iVar13 = (int)uVar12;
              if ((iVar13 < 0) || (p_00->nSize <= iVar13)) {
LAB_007aa1a0:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              Vec_IntPush(pVVar7,p_00->pArray[uVar12 & 0xffffffff]);
            }
            uVar14 = *(uint *)(&pGVar4->field_0x0 + lVar11);
            uVar20 = vCut->nSize;
            uVar2 = vCut->nCap;
            if (uVar20 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vCut->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(vCut->pArray,0x80);
                }
                iVar13 = 0x10;
              }
              else {
                iVar13 = uVar2 * 2;
                if (iVar13 <= (int)uVar2) goto LAB_007a9de5;
                if (vCut->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar8 = (void **)realloc(vCut->pArray,(ulong)uVar2 << 4);
                }
              }
              vCut->pArray = ppvVar8;
              vCut->nCap = iVar13;
            }
LAB_007a9de5:
            vCut->nSize = uVar20 + 1;
            vCut->pArray[(int)uVar20] =
                 (void *)((long)pGVar4 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3 + lVar11);
            uVar14 = (uint)*(undefined8 *)(&pGVar4->field_0x0 + lVar11) & 0x1fffffff;
            pGVar18 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar14 * 4) * -3 + lVar11);
            pGVar17 = p->pObjs;
            if ((pGVar18 < pGVar17) || (pGVar17 + p->nObjs <= pGVar18)) {
LAB_007aa181:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar13 = (int)((long)((long)pGVar4 +
                                 lVar11 + ((ulong)(uVar14 << 2) * -3 - (long)pGVar17)) >> 2) *
                     -0x55555555;
            if (p->nTravIdsAlloc <= iVar13) {
LAB_007aa1de:
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            p->pTravIds[iVar13] = p->nTravIds;
          }
        }
        uVar14 = (uint)*(undefined8 *)(&pGVar4->field_0x0 + lVar11);
        if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
          uVar14 = (uint)((ulong)*(undefined8 *)(&pGVar4->field_0x0 + lVar11) >> 0x20);
          uVar20 = uVar14 & 0x1fffffff;
          pGVar18 = (Gia_Obj_t *)((long)pGVar4 + lVar11 + (ulong)(uVar20 * 4) * -3);
          pGVar17 = p->pObjs;
          if ((pGVar18 < pGVar17) || (pGVar17 + p->nObjs <= pGVar18)) goto LAB_007aa181;
          iVar13 = (int)((long)((long)pGVar4 + lVar11 + ((ulong)(uVar20 << 2) * -3 - (long)pGVar17))
                        >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar13) goto LAB_007aa1bf;
          if (p->pTravIds[iVar13] == p->nTravIds + -1) {
            if (pVVar7 != (Vec_Int_t *)0x0) {
              uVar12 = (ulong)-(uVar14 & 0x1fffffff) + lVar15;
              iVar13 = (int)uVar12;
              if ((iVar13 < 0) || (p_00->nSize <= iVar13)) goto LAB_007aa1a0;
              Vec_IntPush(pVVar7,p_00->pArray[uVar12 & 0xffffffff]);
            }
            uVar14 = *(uint *)(&pGVar4->field_0x4 + lVar11);
            uVar20 = vCut->nSize;
            uVar2 = vCut->nCap;
            if (uVar20 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vCut->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(vCut->pArray,0x80);
                }
                iVar13 = 0x10;
              }
              else {
                iVar13 = uVar2 * 2;
                if (iVar13 <= (int)uVar2) goto LAB_007a9ffc;
                if (vCut->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar8 = (void **)realloc(vCut->pArray,(ulong)uVar2 << 4);
                }
              }
              vCut->pArray = ppvVar8;
              vCut->nCap = iVar13;
            }
LAB_007a9ffc:
            vCut->nSize = uVar20 + 1;
            vCut->pArray[(int)uVar20] =
                 (void *)((long)pGVar4 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3 + lVar11);
            uVar14 = *(uint *)(&pGVar4->field_0x4 + lVar11) & 0x1fffffff;
            pGVar18 = (Gia_Obj_t *)((long)pGVar4 + (ulong)(uVar14 * 4) * -3 + lVar11);
            pGVar17 = p->pObjs;
            if ((pGVar18 < pGVar17) || (pGVar17 + p->nObjs <= pGVar18)) goto LAB_007aa181;
            iVar13 = (int)((long)((long)pGVar4 +
                                 lVar11 + ((ulong)(uVar14 << 2) * -3 - (long)pGVar17)) >> 2) *
                     -0x55555555;
            if (p->nTravIdsAlloc <= iVar13) goto LAB_007aa1de;
            p->pTravIds[iVar13] = p->nTravIds;
          }
        }
      }
      lVar15 = lVar15 + 1;
      uVar12 = (ulong)p->nObjs;
      lVar11 = lVar11 + 0xc;
    } while (lVar15 < (long)uVar12);
  }
  if ((pVVar7 != (Vec_Int_t *)0x0) && (pVVar7->nSize != vCut->nSize)) {
    __assert_fail("vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRetime.c"
                  ,0xf6,"Gia_Man_t *Gia_ManRetimeForwardOne(Gia_Man_t *, int *, int *)");
  }
  pGVar9 = Gia_ManRetimeDupForward(p,vCut);
  if (vCut->pArray != (void **)0x0) {
    free(vCut->pArray);
    vCut->pArray = (void **)0x0;
  }
  free(vCut);
  if (p_00 != (Vec_Int_t *)0x0) {
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
  }
  pGVar9->vFlopClasses = pVVar7;
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManRetimeForwardOne( Gia_Man_t * p, int * pnRegFixed, int * pnRegMoves )
{
    Vec_Int_t * vFlopClasses = NULL;
    Vec_Int_t * vObjClasses = NULL;
    Gia_Man_t * pNew;
    Vec_Ptr_t * vCut;
    Gia_Obj_t * pObj;
    int i;
    if ( p->vFlopClasses )
    {
//        printf( "Performing retiming with register classes.\n" );
        vObjClasses = Vec_IntAlloc( Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Vec_IntPush( vObjClasses, -1 );
        Gia_ManForEachRo( p, pObj, i )
            Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(p->vFlopClasses, i) );
        vFlopClasses = Vec_IntAlloc( Gia_ManRegNum(p) );
    }
    // mark the retimable nodes
    Gia_ManIncrementTravId( p );
    Gia_ManMarkAutonomous( p );
    // mark the retimable registers with the fresh trav ID
    Gia_ManIncrementTravId( p );
    *pnRegFixed = 0;
    Gia_ManForEachRo( p, pObj, i )
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            Gia_ObjSetTravIdCurrent(p, pObj);
        else
            (*pnRegFixed)++;
    // mark all the nodes that can be retimed forward
    *pnRegMoves = 0;
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vObjClasses && Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) != Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) )
                continue;
            if ( vObjClasses )
                Vec_IntWriteEntry( vObjClasses, Gia_ObjId(p, pObj), Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Gia_ObjSetTravIdCurrent(p, pObj);
            (*pnRegMoves)++;
        }
    // mark the remaining registers
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetTravIdCurrent(p, pObj);
    // find the cut (all such marked objects that fanout into unmarked nodes)
    vCut = Vec_PtrAlloc( 1000 );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdPrevious(p, pObj) )
            continue;
        if ( (Gia_ObjIsCo(pObj) || Gia_ObjIsAnd(pObj)) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin0(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId0(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
        }
        if ( Gia_ObjIsAnd(pObj) && Gia_ObjIsTravIdPrevious(p, Gia_ObjFanin1(pObj)) )
        {
            if ( vFlopClasses )
                Vec_IntPush( vFlopClasses, Vec_IntEntry(vObjClasses, Gia_ObjFaninId1(pObj, i)) );
            Vec_PtrPush( vCut, Gia_ObjFanin1(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    }
    assert( vFlopClasses == NULL || Vec_IntSize(vFlopClasses) == Vec_PtrSize(vCut) );
    // finally derive the new manager
    pNew = Gia_ManRetimeDupForward( p, vCut );
    Vec_PtrFree( vCut );
    if ( vObjClasses )
    Vec_IntFree( vObjClasses );
    pNew->vFlopClasses = vFlopClasses;
    return pNew;
}